

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lasreaditemcompressed_v2.cpp
# Opt level: O1

void __thiscall
LASreadItemCompressed_GPSTIME11_v2::LASreadItemCompressed_GPSTIME11_v2
          (LASreadItemCompressed_GPSTIME11_v2 *this,ArithmeticDecoder *dec)

{
  ArithmeticModel *pAVar1;
  IntegerCompressor *this_00;
  
  (this->super_LASreadItemCompressed).super_LASreadItem._vptr_LASreadItem =
       (_func_int **)&PTR_read_0015e780;
  this->last_gpstime[0].u64 = 0;
  this->last_gpstime[1].u64 = 0;
  this->last_gpstime[2].u64 = 0;
  this->last_gpstime[3].u64 = 0;
  this->last_gpstime_diff[0] = 0;
  this->last_gpstime_diff[1] = 0;
  this->last_gpstime_diff[2] = 0;
  this->last_gpstime_diff[3] = 0;
  this->multi_extreme_counter[0] = 0;
  this->multi_extreme_counter[1] = 0;
  this->multi_extreme_counter[2] = 0;
  this->multi_extreme_counter[3] = 0;
  if (dec != (ArithmeticDecoder *)0x0) {
    this->dec = dec;
    pAVar1 = ArithmeticDecoder::createSymbolModel(dec,0x204);
    this->m_gpstime_multi = pAVar1;
    pAVar1 = ArithmeticDecoder::createSymbolModel(dec,6);
    this->m_gpstime_0diff = pAVar1;
    this_00 = (IntegerCompressor *)operator_new(0x48);
    IntegerCompressor::IntegerCompressor(this_00,dec,0x20,9,8,0);
    this->ic_gpstime = this_00;
    this->last = 0;
    return;
  }
  __assert_fail("dec",
                "/workspace/llm4binary/github/license_c_cmakelists/LASzip[P]LASzip/src/lasreaditemcompressed_v2.cpp"
                ,0x100,
                "LASreadItemCompressed_GPSTIME11_v2::LASreadItemCompressed_GPSTIME11_v2(ArithmeticDecoder *)"
               );
}

Assistant:

LASreadItemCompressed_GPSTIME11_v2::LASreadItemCompressed_GPSTIME11_v2(ArithmeticDecoder* dec)
{
  /* set decoder */
  assert(dec);
  this->dec = dec;
  /* create entropy models and integer compressors */
  m_gpstime_multi = dec->createSymbolModel(LASZIP_GPSTIME_MULTI_TOTAL);
  m_gpstime_0diff = dec->createSymbolModel(6);
  ic_gpstime = new IntegerCompressor(dec, 32, 9); // 32 bits, 9 contexts
  last = 0;
}